

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O1

void __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
UpdateBlock(BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this,IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *Node)

{
  pointer pcVar1;
  size_t __n;
  int iVar2;
  iterator it;
  Block B;
  string local_20d0;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20b0;
  long *local_2050;
  size_t local_2048;
  long local_2040 [2];
  int local_2030 [2050];
  
  iVar2 = (Node->self).BlockNum;
  pcVar1 = blocks.buffer[iVar2].FileName._M_dataplus._M_p;
  local_2050 = local_2040;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2050,pcVar1,pcVar1 + blocks.buffer[iVar2].FileName._M_string_length);
  memcpy(local_2030,&blocks.buffer[iVar2].FileOff,0x2004);
  if (((Node->self).FileOff == local_2030[0]) &&
     (__n = (this->Index_FileName)._M_string_length, __n == local_2048)) {
    if (__n == 0) goto LAB_00132ec5;
    iVar2 = bcmp((this->Index_FileName)._M_dataplus._M_p,local_2050,__n);
    if (iVar2 == 0) goto LAB_00132ec5;
  }
  pcVar1 = (this->Index_FileName)._M_dataplus._M_p;
  local_20d0._M_dataplus._M_p = (pointer)&local_20d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_20d0,pcVar1,pcVar1 + (this->Index_FileName)._M_string_length);
  iVar2 = Buffer::Allocate(&blocks,&local_20d0,(Node->self).FileOff);
  (Node->self).BlockNum = iVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_20d0._M_dataplus._M_p != &local_20d0.field_2) {
    operator_delete(local_20d0._M_dataplus._M_p,local_20d0.field_2._M_allocated_capacity + 1);
  }
LAB_00132ec5:
  local_20b0.NodeState = Node->NodeState;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_20b0.k,&Node->k);
  std::vector<char,_std::allocator<char>_>::vector(&local_20b0.v,&Node->v);
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_20b0.p,&Node->p);
  local_20b0.parent = Node->parent;
  local_20b0.self = Node->self;
  Node2Block(this,&local_20b0);
  if (local_20b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_20b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_20b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_20b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_20b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_20b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_20b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_20b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_20b0.k);
  it = Buffer::Find(&blocks,(Node->self).BlockNum);
  Buffer::Update(&blocks,it);
  if (local_2050 != local_2040) {
    operator_delete(local_2050,local_2040[0] + 1);
  }
  return;
}

Assistant:

void BpTree<K>::UpdateBlock(IndexNode<K> Node) {
	Block B = blocks.buffer[Node.self.BlockNum];
	if (Node.self.FileOff != B.FileOff || this->Index_FileName != B.FileName) {
		//�����һ���Ѿ�������ռ�죬��Ҫ����µ�һ��
		Node.self.BlockNum = blocks.Allocate(this->Index_FileName, Node.self.FileOff);
	}
	this->Node2Block(Node);
	blocks.Update(blocks.Find(Node.self.BlockNum));
}